

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  ulong uVar1;
  void *__src;
  Header *pHVar2;
  String *pSVar3;
  Fault FVar4;
  Iterator __end1;
  Header *pHVar5;
  Exception *target;
  StringPtr *pSVar6;
  size_t sVar7;
  Header *header_1;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  unsigned_long i_1;
  ulong uVar11;
  Fault f_1;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  StringPtr space;
  Fault local_d0;
  StringPtr local_c8;
  String *local_b8;
  StringPtr *local_b0;
  size_t local_a8;
  Fault local_a0;
  DebugComparison<char_*&,_char_*> local_98;
  HttpHeaders *local_70;
  size_t local_68;
  StringPtr local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_50.size_ = word2.size_;
  local_50.ptr = word2.ptr;
  sVar7 = word1.size_;
  local_40.ptr = word1.ptr;
  local_60.content.ptr = " ";
  local_60.content.size_ = 2;
  local_c8.content.ptr = "\r\n";
  local_c8.content.size_ = 3;
  local_98.right = (char *)(this->indexedHeaders).size_;
  local_98.left = (char **)connectionHeaders.size_;
  local_98.op.content.ptr = " <= ";
  local_98.op.content.size_ = 5;
  local_98.result = connectionHeaders.size_ <= local_98.right;
  local_40.size_ = sVar7;
  if (local_98.right < connectionHeaders.size_) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x441,FAILED,"connectionHeaders.size() <= indexedHeaders.size()","_kjCondition,",
               (DebugComparison<unsigned_long,_unsigned_long> *)&local_98);
    kj::_::Debug::Fault::fatal(&local_d0);
  }
  sVar8 = 2;
  if (sVar7 != 0) {
    sVar8 = word3.size_ + 6 + local_50.size_ + sVar7;
  }
  if (local_98.right != (char *)0x0) {
    lVar9 = 8;
    pcVar10 = (char *)0x0;
    do {
      pSVar6 = (this->indexedHeaders).ptr;
      if (pcVar10 < connectionHeaders.size_) {
        pSVar6 = connectionHeaders.ptr;
      }
      uVar11 = *(ulong *)((long)&(pSVar6->content).ptr + lVar9);
      if (1 < uVar11) {
        sVar8 = sVar8 + uVar11 +
                (this->table->namesById).builder.ptr[(ulong)pcVar10 & 0xffffffff].content.size_ + 2;
      }
      pcVar10 = pcVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (local_98.right != pcVar10);
  }
  for (pHVar5 = (this->unindexedHeaders).builder.ptr; pHVar5 != (this->unindexedHeaders).builder.pos
      ; pHVar5 = pHVar5 + 1) {
    sVar8 = sVar8 + (pHVar5->name).content.size_ + (pHVar5->value).content.size_ + 2;
  }
  heapString(__return_storage_ptr__,sVar8);
  target = (Exception *)(__return_storage_ptr__->content).size_;
  if (target != (Exception *)0x0) {
    target = (Exception *)(__return_storage_ptr__->content).ptr;
  }
  local_b8 = __return_storage_ptr__;
  if (sVar7 != 0) {
    target = (Exception *)
             kj::_::
             fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                       ((char *)target,&local_40,&local_60,&local_50,&local_60,&word3,&local_c8);
    local_d0.exception = target;
  }
  sVar7 = (this->indexedHeaders).size_;
  if (sVar7 != 0) {
    local_68 = connectionHeaders.size_;
    lVar9 = 8;
    uVar11 = 0;
    local_b0 = connectionHeaders.ptr;
    local_a8 = sVar7;
    local_70 = this;
    do {
      pSVar6 = connectionHeaders.ptr;
      if (local_68 <= uVar11) {
        pSVar6 = (this->indexedHeaders).ptr;
      }
      uVar1 = *(ulong *)((long)&(pSVar6->content).ptr + lVar9);
      FVar4.exception = local_d0.exception;
      if (1 < uVar1) {
        __src = *(void **)((long)pSVar6 + lVar9 + -8);
        pSVar6 = (this->table->namesById).builder.ptr;
        pcVar10 = pSVar6[uVar11 & 0xffffffff].content.ptr;
        sVar7 = pSVar6[uVar11 & 0xffffffff].content.size_;
        if (pcVar10 != pcVar10 + (sVar7 - 1)) {
          memcpy(target,pcVar10,sVar7 - 1);
          target = (Exception *)((long)target->trace + (sVar7 - 0x69));
        }
        this = local_70;
        *(undefined2 *)&(target->ownFile).content.ptr = 0x203a;
        target = (Exception *)((long)&(target->ownFile).content.ptr + 2);
        if (__src != (void *)((long)__src + (uVar1 - 1))) {
          memcpy(target,__src,uVar1 - 1);
          target = (Exception *)((long)target->trace + (uVar1 - 0x69));
        }
        sVar8 = local_c8.content.size_;
        sVar7 = local_a8;
        connectionHeaders.ptr = local_b0;
        FVar4.exception = target;
        if (local_c8.content.ptr != local_c8.content.ptr + (local_c8.content.size_ - 1)) {
          memcpy(target,local_c8.content.ptr,local_c8.content.size_ - 1);
          target = (Exception *)((long)target->trace + (sVar8 - 0x69));
          sVar7 = local_a8;
          connectionHeaders.ptr = local_b0;
          FVar4.exception = target;
        }
      }
      local_d0.exception = FVar4.exception;
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x10;
    } while (sVar7 != uVar11);
  }
  pSVar3 = local_b8;
  pHVar2 = (this->unindexedHeaders).builder.pos;
  sVar7 = local_c8.content.size_;
  for (pHVar5 = (this->unindexedHeaders).builder.ptr; local_c8.content.size_ = sVar7,
      pHVar5 != pHVar2; pHVar5 = pHVar5 + 1) {
    pcVar10 = (pHVar5->name).content.ptr;
    sVar7 = (pHVar5->name).content.size_;
    if (pcVar10 != pcVar10 + (sVar7 - 1)) {
      memcpy(target,pcVar10,sVar7 - 1);
      target = (Exception *)((long)target->trace + (sVar7 - 0x69));
    }
    *(undefined2 *)&(target->ownFile).content.ptr = 0x203a;
    target = (Exception *)((long)&(target->ownFile).content.ptr + 2);
    pcVar10 = (pHVar5->value).content.ptr;
    sVar7 = (pHVar5->value).content.size_;
    if (pcVar10 != pcVar10 + (sVar7 - 1)) {
      memcpy(target,pcVar10,sVar7 - 1);
      target = (Exception *)((long)target->trace + (sVar7 - 0x69));
    }
    sVar7 = local_c8.content.size_;
    if (local_c8.content.ptr != local_c8.content.ptr + (local_c8.content.size_ - 1)) {
      memcpy(target,local_c8.content.ptr,local_c8.content.size_ - 1);
      target = (Exception *)((long)target->trace + (sVar7 - 0x69));
    }
    sVar7 = local_c8.content.size_;
  }
  if (local_c8.content.ptr != local_c8.content.ptr + (sVar7 - 1)) {
    memcpy(target,local_c8.content.ptr,sVar7 - 1);
    target = (Exception *)((long)target->trace + (sVar7 - 0x69));
  }
  local_98.left = (char **)&local_d0;
  sVar7 = (pSVar3->content).size_;
  local_98.right = (pSVar3->content).ptr + (sVar7 - 1);
  if (sVar7 == 0) {
    local_98.right = (char *)0x0;
  }
  local_98.op.content.ptr = " == ";
  local_98.op.content.size_ = 5;
  local_98.result = target == (Exception *)local_98.right;
  if (local_98.result) {
    return pSVar3;
  }
  local_d0.exception = target;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
            (&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x45d,FAILED,"ptr == result.end()","_kjCondition,",&local_98);
  kj::_::Debug::Fault::fatal(&local_a0);
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}